

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

void Hex2RGB(char *aHexRGB,uchar *aoResultRGB)

{
  ulong uVar1;
  char lColorChannel [8];
  char local_20;
  char local_1f [2];
  char local_1d [2];
  char local_1b [3];
  
  if (aoResultRGB != (uchar *)0x0) {
    if (aHexRGB == (char *)0x0) {
      aoResultRGB[0] = '\0';
      aoResultRGB[1] = '\0';
      aoResultRGB[2] = '\0';
    }
    else {
      strcpy(&local_20,aHexRGB);
      uVar1 = strtoul(local_1b,(char **)0x0,0x10);
      aoResultRGB[2] = (uchar)uVar1;
      local_1b[0] = '\0';
      uVar1 = strtoul(local_1d,(char **)0x0,0x10);
      aoResultRGB[1] = (uchar)uVar1;
      local_1d[0] = '\0';
      uVar1 = strtoul(local_1f,(char **)0x0,0x10);
      *aoResultRGB = (uchar)uVar1;
    }
  }
  return;
}

Assistant:

static void Hex2RGB( char const aHexRGB[8] , unsigned char aoResultRGB[3] )
{
        char lColorChannel[8] ;
        if ( aoResultRGB )
        {
                if ( aHexRGB )
                {
                        strcpy(lColorChannel, aHexRGB ) ;
                        aoResultRGB[2] = (unsigned char)strtoul(lColorChannel+5,NULL,16);
                        lColorChannel[5] = '\0';
                        aoResultRGB[1] = (unsigned char)strtoul(lColorChannel+3,NULL,16);
                        lColorChannel[3] = '\0';
                        aoResultRGB[0] = (unsigned char)strtoul(lColorChannel+1,NULL,16);
/* printf("%d %d %d\n", aoResultRGB[0], aoResultRGB[1], aoResultRGB[2]); */
                }
                else
                {
                        aoResultRGB[0]=0;
                        aoResultRGB[1]=0;
                        aoResultRGB[2]=0;
                }
        }
}